

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsimplex_p.cpp
# Opt level: O0

void __thiscall QSimplex::reducedRowEchelon(QSimplex *this)

{
  QSimplex *in_RDI;
  qreal qVar1;
  qreal unaff_retaddr;
  int in_stack_00000008;
  int in_stack_0000000c;
  QSimplex *in_stack_00000010;
  int factorInObjectiveRow;
  int i;
  int local_c;
  
  for (local_c = 1; local_c < in_RDI->rows; local_c = local_c + 1) {
    qVar1 = valueAt(in_RDI,local_c,0);
    valueAt(in_RDI,0,(int)qVar1);
    combineRows(in_stack_00000010,in_stack_0000000c,in_stack_00000008,unaff_retaddr);
  }
  return;
}

Assistant:

void QSimplex::reducedRowEchelon()
{
    for (int i = 1; i < rows; ++i) {
        int factorInObjectiveRow = valueAt(i, 0);
        combineRows(0, i, -1 * valueAt(0, factorInObjectiveRow));
    }
}